

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  int iVar1;
  byte bVar2;
  undefined4 in_EAX;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  i64 iVar6;
  int iVar7;
  int iVal;
  undefined8 uStack_38;
  
  iVar7 = *pi;
  if (iVar7 < n) {
    iVar6 = *piOff;
    bVar2 = a[iVar7];
    uStack_38 = (ulong)CONCAT14(bVar2,in_EAX);
    iVar3 = 1;
    uVar4 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      iVar3 = sqlite3Fts5GetVarint32(a + iVar7,(u32 *)((long)&uStack_38 + 4));
      uVar4 = uStack_38._4_4_;
    }
    iVar7 = iVar7 + iVar3;
    if (uVar4 == 1) {
      bVar2 = a[iVar7];
      uVar5 = (ulong)bVar2;
      uStack_38 = (ulong)CONCAT14(bVar2,(undefined4)uStack_38);
      iVar3 = 1;
      if ((char)bVar2 < '\0') {
        iVar3 = sqlite3Fts5GetVarint32(a + iVar7,(u32 *)((long)&uStack_38 + 4));
        uVar5 = uStack_38 >> 0x20;
      }
      iVar1 = iVar3 + iVar7;
      iVar6 = uVar5 << 0x20;
      bVar2 = a[iVar1];
      uStack_38 = (ulong)CONCAT14(bVar2,(undefined4)uStack_38);
      if ((char)bVar2 < '\0') {
        iVar7 = sqlite3Fts5GetVarint32(a + iVar1,(u32 *)((long)&uStack_38 + 4));
        iVar7 = iVar1 + iVar7;
        uVar4 = uStack_38._4_4_;
      }
      else {
        iVar7 = iVar7 + iVar3 + 1;
        uVar4 = (uint)bVar2;
      }
    }
    *piOff = (ulong)(uVar4 + 0x7ffffffe & 0x7fffffff) + iVar6;
    *pi = iVar7;
    iVar7 = 0;
  }
  else {
    *piOff = -1;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;  
  }else{
    i64 iOff = *piOff;
    int iVal;
    fts5FastGetVarint32(a, i, iVal);
    if( iVal==1 ){
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      fts5FastGetVarint32(a, i, iVal);
    }
    *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    *pi = i;
    return 0;
  }
}